

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handshake.cc
# Opt level: O2

ssl_hs_wait_t bssl::ssl_get_finished(SSL_HANDSHAKE *hs)

{
  SSL *ssl;
  bool bVar1;
  int iVar2;
  SSL_SESSION *session;
  ssl_hs_wait_t sVar3;
  long lVar4;
  int line;
  Span<const_unsigned_char> in;
  size_t finished_len;
  SSLMessage msg;
  uint8_t finished [64];
  
  ssl = hs->ssl;
  bVar1 = (*ssl->method->get_message)(ssl,&msg);
  if (bVar1) {
    bVar1 = ssl_check_message_type(ssl,&msg,0x14);
    sVar3 = ssl_hs_error;
    if (bVar1) {
      session = (hs->new_session)._M_t.
                super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
                super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl;
      if (session == (SSL_SESSION *)0x0) {
        session = (hs->ssl->session)._M_t.
                  super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
                  super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                  super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl;
      }
      bVar1 = SSLTranscript::GetFinishedMAC
                        (&hs->transcript,finished,&finished_len,session,(bool)(~ssl->field_0xa4 & 1)
                        );
      sVar3 = ssl_hs_error;
      if ((bVar1) && (bVar1 = ssl_hash_message(hs,&msg), sVar3 = ssl_hs_error, bVar1)) {
        iVar2 = CBS_mem_equal(&msg.body,finished,finished_len);
        if (iVar2 == 0) {
          ssl_send_alert(ssl,2,0x33);
          iVar2 = 0x8e;
          line = 0x18c;
        }
        else if (finished_len < 0xd) {
          lVar4 = 0x1f0;
          if ((ssl->field_0xa4 & 1) != 0) {
            lVar4 = 0x1e3;
          }
          in.size_ = finished_len;
          in.data_ = finished;
          InplaceVector<unsigned_char,_12UL>::CopyFrom
                    ((InplaceVector<unsigned_char,_12UL> *)(ssl->s3->server_random + lVar4 + -0x10),
                     in);
          bVar1 = (*ssl->method->has_unprocessed_handshake_data)(ssl);
          if (!bVar1) {
            (*ssl->method->next_message)(ssl);
            return ssl_hs_ok;
          }
          ssl_send_alert(ssl,2,10);
          iVar2 = 0xff;
          line = 0x1a0;
        }
        else {
          iVar2 = 0x44;
          line = 0x193;
        }
        sVar3 = ssl_hs_error;
        ERR_put_error(0x10,0,iVar2,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/handshake.cc"
                      ,line);
      }
    }
  }
  else {
    sVar3 = ssl_hs_read_message;
  }
  return sVar3;
}

Assistant:

enum ssl_hs_wait_t ssl_get_finished(SSL_HANDSHAKE *hs) {
  SSL *const ssl = hs->ssl;
  SSLMessage msg;
  if (!ssl->method->get_message(ssl, &msg)) {
    return ssl_hs_read_message;
  }

  if (!ssl_check_message_type(ssl, msg, SSL3_MT_FINISHED)) {
    return ssl_hs_error;
  }

  // Snapshot the finished hash before incorporating the new message.
  uint8_t finished[EVP_MAX_MD_SIZE];
  size_t finished_len;
  if (!hs->transcript.GetFinishedMAC(finished, &finished_len,
                                     ssl_handshake_session(hs), !ssl->server) ||
      !ssl_hash_message(hs, msg)) {
    return ssl_hs_error;
  }

  bool finished_ok = CBS_mem_equal(&msg.body, finished, finished_len);
  if (CRYPTO_fuzzer_mode_enabled()) {
    finished_ok = true;
  }
  if (!finished_ok) {
    ssl_send_alert(ssl, SSL3_AL_FATAL, SSL_AD_DECRYPT_ERROR);
    OPENSSL_PUT_ERROR(SSL, SSL_R_DIGEST_CHECK_FAILED);
    return ssl_hs_error;
  }

  // Copy the Finished so we can use it for renegotiation checks.
  if (finished_len > ssl->s3->previous_client_finished.capacity() ||
      finished_len > ssl->s3->previous_server_finished.capacity()) {
    OPENSSL_PUT_ERROR(SSL, ERR_R_INTERNAL_ERROR);
    return ssl_hs_error;
  }

  if (ssl->server) {
    ssl->s3->previous_client_finished.CopyFrom(Span(finished, finished_len));
  } else {
    ssl->s3->previous_server_finished.CopyFrom(Span(finished, finished_len));
  }

  // The Finished message should be the end of a flight.
  if (ssl->method->has_unprocessed_handshake_data(ssl)) {
    ssl_send_alert(ssl, SSL3_AL_FATAL, SSL_AD_UNEXPECTED_MESSAGE);
    OPENSSL_PUT_ERROR(SSL, SSL_R_EXCESS_HANDSHAKE_DATA);
    return ssl_hs_error;
  }

  ssl->method->next_message(ssl);
  return ssl_hs_ok;
}